

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O0

void __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::insert
          (miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *this,
          spectral_operation *trans)

{
  uint uVar1;
  undefined4 uVar2;
  ulong __new_size;
  size_type sVar3;
  reference pvVar4;
  vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
  *in_RSI;
  long in_RDI;
  
  __new_size = (ulong)*(uint *)(in_RDI + 0xc0);
  sVar3 = std::
          vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
          ::size((vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
                  *)(in_RDI + 0x90));
  if (sVar3 <= __new_size) {
    std::
    vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>::
    size((vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
          *)(in_RDI + 0x90));
    std::
    vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>::
    resize(in_RSI,__new_size);
  }
  uVar1 = *(uint *)(in_RDI + 0xc0);
  *(uint *)(in_RDI + 0xc0) = uVar1 + 1;
  pvVar4 = std::
           vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
           ::operator[]((vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
                         *)(in_RDI + 0x90),(ulong)uVar1);
  uVar2 = *(undefined4 *)
           &(in_RSI->
            super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar4->_kind = (short)uVar2;
  pvVar4->_var1 = (short)((uint)uVar2 >> 0x10);
  pvVar4->_var2 =
       *(uint16_t *)
        ((long)&(in_RSI->
                super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
                )._M_impl.super__Vector_impl_data._M_start + 4);
  return;
}

Assistant:

void insert( const spectral_operation& trans )
  {
    if ( transform_index >= transforms.size() )
    {
      transforms.resize( transforms.size() << 1 );
    }
    assert( transform_index < transforms.size() );
    transforms[transform_index++] = trans;
  }